

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTComputeShader::configureProgram
          (TextureCubeMapArrayTextureSizeRTComputeShader *this)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  char *csCode;
  
  iVar2 = (*((this->super_TextureCubeMapArrayTextureSizeRTBase).
             super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  csCode = 
  "${VERSION}\n\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\nprecision highp float;\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\n                               uniform highp samplerCubeArray       texture_std_sampler;\n                               uniform highp samplerCubeArrayShadow texture_shw_sampler;\nlayout(rgba32f,  binding = 0)  writeonly uniform highp imageCubeArray         texture_img_sampler;\n\nlayout (rgba32ui, binding = 1) uniform highp writeonly uimage2D image_std_size;\nlayout (rgba32ui, binding = 2) uniform highp writeonly uimage2D image_shw_size;\nlayout (rgba32ui, binding = 3) uniform highp writeonly uimage2D image_img_size;\n\nvoid main(void)\n{\n    imageStore(image_std_size, ivec2(0,0),  uvec4(uvec3( textureSize(texture_std_sampler, 0)), 0) );\n    imageStore(image_shw_size, ivec2(0,0),  uvec4(uvec3( textureSize(texture_shw_sampler, 0)), 0) );\n    imageStore(image_img_size, ivec2(0,0),  uvec4(uvec3( imageSize  (texture_img_sampler)), 0) );\n}\n"
  ;
  uVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x3f0))(0x91b9);
  *(undefined4 *)&(this->super_TextureCubeMapArrayTextureSizeRTBase).field_0x2cc = uVar3;
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"Could not create shader object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x5bc);
  bVar1 = TestCaseBase::buildProgram
                    ((TestCaseBase *)this,
                     (this->super_TextureCubeMapArrayTextureSizeRTBase).
                     super_TextureCubeMapArrayTextureSizeBase.m_po_id,
                     *(GLuint *)&(this->super_TextureCubeMapArrayTextureSizeRTBase).field_0x2cc,1,
                     &csCode,(bool *)0x0);
  if (bVar1) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Could not compile/link program object from valid shader code.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
             ,0x5c1);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArrayTextureSizeRTComputeShader::configureProgram(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const char* csCode = getComputeShaderCode();

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object.");

	/* Build program */
	if (!buildProgram(m_po_id, m_cs_id, 1 /* part */, &csCode))
	{
		TCU_FAIL("Could not compile/link program object from valid shader code.");
	}
}